

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O0

uint32_t bech32_polymod_step(uint32_t pre)

{
  byte bVar1;
  uint8_t b;
  uint32_t pre_local;
  
  bVar1 = (byte)(pre >> 0x19);
  return (pre & 0x1ffffff) << 5 ^ -(bVar1 & 1) & 0x3b6a57b2 ^
         -((int)(uint)bVar1 >> 1 & 1U) & 0x26508e6d ^ -((int)(uint)bVar1 >> 2 & 1U) & 0x1ea119fa ^
         -((int)(uint)bVar1 >> 3 & 1U) & 0x3d4233dd ^ -((int)(uint)bVar1 >> 4 & 1U) & 0x2a1462b3;
}

Assistant:

static uint32_t bech32_polymod_step(uint32_t pre) {
    uint8_t b = pre >> 25;
    return ((pre & 0x1FFFFFF) << 5) ^
           (-((b >> 0) & 1) & 0x3b6a57b2UL) ^
           (-((b >> 1) & 1) & 0x26508e6dUL) ^
           (-((b >> 2) & 1) & 0x1ea119faUL) ^
           (-((b >> 3) & 1) & 0x3d4233ddUL) ^
           (-((b >> 4) & 1) & 0x2a1462b3UL);
}